

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

tuple<std::vector<int,_std::allocator<int>_>_> *
cppqc::detail::TupleGeneratorHelper_unGen<0,std::vector<int,std::allocator<int>>>::
unGen<std::tuple<cppqc::Generator<std::vector<int,std::allocator<int>>>>>
          (RngEngine *rng,size_t size,
          tuple<cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_> *generators)

{
  tuple<std::vector<int,_std::allocator<int>_>_> *in_RDI;
  tuple<std::vector<int,_std::allocator<int>_>_> *this;
  size_t in_stack_ffffffffffffffc8;
  RngEngine *in_stack_ffffffffffffffd0;
  Generator<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  std::get<0ul,cppqc::Generator<std::vector<int,std::allocator<int>>>>
            ((tuple<cppqc::Generator<std::vector<int,_std::allocator<int>_>_>_> *)0x12396e);
  Generator<std::vector<int,_std::allocator<int>_>_>::unGen
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::tuple<std::vector<int,_std::allocator<int>_>_>::
  tuple<std::vector<int,_std::allocator<int>_>,_true,_true>
            (this,(vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd0);
  return this;
}

Assistant:

static std::tuple<T> unGen(RngEngine& rng,
                             std::size_t size,
                             const Generators& generators) {
    return std::tuple<T>(std::get<offset>(generators).unGen(rng, size));
  }